

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O2

void Psr_ManRemapOne(Vec_Int_t *vSigs,Psr_Ntk_t *pNtkBox,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *__assertion;
  
  iVar4 = 0;
  while ((iVar4 < (pNtkBox->vInputs).nSize &&
         (iVar1 = Vec_IntEntry(&pNtkBox->vInputs,iVar4), iVar1 != 0))) {
    iVar2 = Vec_IntEntry(vMap,iVar1);
    if (iVar2 != -1) {
      __assertion = "Vec_IntEntry(vMap, NameId) == -1";
      uVar3 = 0x65;
      goto LAB_0031d314;
    }
    iVar4 = iVar4 + 1;
    Vec_IntWriteEntry(vMap,iVar1,iVar4);
  }
  iVar4 = 0;
  while ((iVar4 < (pNtkBox->vOutputs).nSize &&
         (iVar1 = Vec_IntEntry(&pNtkBox->vOutputs,iVar4), iVar1 != 0))) {
    iVar2 = Vec_IntEntry(vMap,iVar1);
    if (iVar2 != -1) {
      __assertion = "Vec_IntEntry(vMap, NameId) == -1";
      uVar3 = 0x6a;
      goto LAB_0031d314;
    }
    iVar4 = iVar4 + 1;
    Vec_IntWriteEntry(vMap,iVar1,(pNtkBox->vInputs).nSize + iVar4);
  }
  uVar3 = vSigs->nSize;
  if ((uVar3 & 1) == 0) {
    iVar4 = 0;
    while( true ) {
      if ((int)uVar3 <= iVar4) {
        iVar4 = 0;
        while ((iVar4 < (pNtkBox->vInputs).nSize &&
               (iVar1 = Vec_IntEntry(&pNtkBox->vInputs,iVar4), iVar1 != 0))) {
          Vec_IntWriteEntry(vMap,iVar1,-1);
          iVar4 = iVar4 + 1;
        }
        iVar4 = 0;
        while( true ) {
          if ((pNtkBox->vOutputs).nSize <= iVar4) {
            return;
          }
          iVar1 = Vec_IntEntry(&pNtkBox->vOutputs,iVar4);
          if (iVar1 == 0) break;
          Vec_IntWriteEntry(vMap,iVar1,-1);
          iVar4 = iVar4 + 1;
        }
        return;
      }
      iVar1 = Vec_IntEntry(vSigs,iVar4);
      iVar2 = Vec_IntEntry(vMap,iVar1);
      if (iVar2 == -1) break;
      iVar1 = Vec_IntEntry(vMap,iVar1);
      Vec_IntWriteEntry(vSigs,iVar4,iVar1);
      iVar4 = iVar4 + 2;
      uVar3 = vSigs->nSize;
    }
    __assertion = "Vec_IntEntry(vMap, NameId) != -1";
    uVar3 = 0x71;
  }
  else {
    __assertion = "Vec_IntSize(vSigs) % 2 == 0";
    uVar3 = 0x6e;
  }
LAB_0031d314:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                ,uVar3,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
}

Assistant:

void Psr_ManRemapOne( Vec_Int_t * vSigs, Psr_Ntk_t * pNtkBox, Vec_Int_t * vMap )
{
    int i, NameId;
    // map formal names into I/O indexes
    Psr_NtkForEachPi( pNtkBox, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) == -1 );
        Vec_IntWriteEntry( vMap, NameId, i + 1 ); // +1 to keep 1st form input non-zero
    }
    Psr_NtkForEachPo( pNtkBox, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) == -1 );
        Vec_IntWriteEntry( vMap, NameId, Psr_NtkPiNum(pNtkBox) + i + 1 ); // +1 to keep 1st form input non-zero
    }
    // remap box
    assert( Vec_IntSize(vSigs) % 2 == 0 );
    Vec_IntForEachEntry( vSigs, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) != -1 );
        Vec_IntWriteEntry( vSigs, i++, Vec_IntEntry(vMap, NameId) );
    }
    // unmap formal inputs
    Psr_NtkForEachPi( pNtkBox, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
    Psr_NtkForEachPo( pNtkBox, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
}